

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QByteArray *
QtStringBuilder::appendToByteArray<char_const(&)[3],QByteArray>
          (QByteArray *a,QStringBuilder<const_char_(&)[3],_QByteArray> *b,char param_3)

{
  ArrayOptions *pAVar1;
  char cVar2;
  size_t __n;
  ulong alloc;
  char *pcVar3;
  Data *pDVar4;
  long lVar5;
  ulong alloc_00;
  char *__dest;
  long lVar6;
  ulong size;
  
  pDVar4 = (a->d).d;
  alloc_00 = (a->d).size;
  size = alloc_00 + (b->b).d.size + 2;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData(a,alloc_00,KeepSize);
    pDVar4 = (a->d).d;
    alloc_00 = (a->d).size;
    alloc = size;
    if (pDVar4 != (Data *)0x0) goto LAB_00435b5b;
LAB_00435b98:
    if (alloc < alloc_00) {
      alloc = alloc_00;
    }
    QByteArray::reallocData(a,alloc,KeepSize);
    pDVar4 = (a->d).d;
    if (pDVar4 != (Data *)0x0) {
      lVar5 = (pDVar4->super_QArrayData).alloc;
LAB_00435bbb:
      if (lVar5 != 0) {
        pAVar1 = &(pDVar4->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      goto LAB_00435bc4;
    }
  }
  else {
LAB_00435b5b:
    lVar5 = (pDVar4->super_QArrayData).alloc;
    pcVar3 = (a->d).ptr;
    lVar6 = ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) + lVar5;
    if ((long)((lVar6 - alloc_00) - (long)pcVar3) < (long)size) {
      alloc = lVar5 * 2;
      if (lVar5 * 2 < (long)size) {
        alloc = size;
      }
      if ((1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar6 - (long)pcVar3 < (long)alloc)) goto LAB_00435b98;
      goto LAB_00435bbb;
    }
LAB_00435bc4:
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_00435bdc;
  }
  QByteArray::reallocData(a,(a->d).size,KeepSize);
LAB_00435bdc:
  __dest = (a->d).ptr + (a->d).size;
  pcVar3 = *b->a;
  cVar2 = *pcVar3;
  while (cVar2 != '\0') {
    pcVar3 = pcVar3 + 1;
    *__dest = cVar2;
    __dest = __dest + 1;
    cVar2 = *pcVar3;
  }
  __n = (b->b).d.size;
  if (__n != 0) {
    memcpy(__dest,(b->b).d.ptr,__n);
  }
  QByteArray::resize(a,size);
  return a;
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}